

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.hpp
# Opt level: O2

void __thiscall ot::commissioner::Interpreter::Value::~Value(Value *this)

{
  std::__cxx11::string::~string((string *)&this->mData);
  std::__cxx11::string::~string((string *)&(this->mError).mMessage);
  return;
}

Assistant:

Value() = default;